

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atexit.c
# Opt level: O3

int main(void)

{
  _func_void **pp_Var1;
  size_t sVar2;
  int iVar3;
  
  if (_PDCLIB_exitptr == 0x28) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/atexit.c, line %d - %s\n"
           ,0x39,"atexit( &checkhandler ) == 0");
    sVar2 = _PDCLIB_exitptr;
  }
  else {
    sVar2 = _PDCLIB_exitptr + 1;
    pp_Var1 = _PDCLIB_exitstack + _PDCLIB_exitptr;
    _PDCLIB_exitptr = sVar2;
    *pp_Var1 = checkhandler;
  }
  iVar3 = 0x20;
  do {
    if (sVar2 == 0x28) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/atexit.c, line %d - %s\n"
             ,0x3d,"atexit( &counthandler ) == 0");
    }
    else {
      _PDCLIB_exitstack[sVar2] = counthandler;
      _PDCLIB_exitptr = sVar2 + 1;
    }
    iVar3 = iVar3 + -1;
    sVar2 = _PDCLIB_exitptr;
  } while (iVar3 != 0);
  return TEST_RESULTS;
}

Assistant:

int atexit( void ( *func )( void ) )
{
    if ( _PDCLIB_exitptr == _PDCLIB_ATEXIT_SLOTS )
    {
        return -1;
    }
    else
    {
        _PDCLIB_exitstack[ _PDCLIB_exitptr++ ] = func;
        return 0;
    }
}